

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,std::__cxx11::string>
          (ExtensionSet *this,char *ptr,MessageLite *containing_type,InternalMetadata *metadata,
          ParseContext *ctx)

{
  byte bVar1;
  undefined1 auVar2 [8];
  _Alloc_hider _Var3;
  ushort *p_00;
  bool bVar4;
  int iVar5;
  MessageLite *pMVar6;
  undefined4 extraout_var;
  uint uVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  uint uVar10;
  uint uVar11;
  ushort *p_01;
  ExtensionSet *this_00;
  string *extension_00;
  pair<const_char_*,_unsigned_int> pVar12;
  pair<const_char_*,_int> pVar13;
  StringPiece val;
  undefined1 local_110 [8];
  ParseContext tmp_ctx;
  ExtensionInfo extension;
  char *p;
  undefined1 local_68 [8];
  string payload;
  ushort *puStack_40;
  bool was_packed_on_wire;
  char *ptr_local;
  
  local_68 = (undefined1  [8])&payload._M_string_length;
  payload._M_dataplus._M_p = (pointer)0x0;
  payload._M_string_length._0_1_ = 0;
  puStack_40 = (ushort *)ptr;
LAB_0021faf7:
  ptr_local = (char *)0x0;
LAB_0021faff:
  while( true ) {
    bVar4 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&stack0xffffffffffffffc0,
                       ctx->group_depth_);
    p_00 = puStack_40;
    p_01 = puStack_40;
    if (bVar4) goto LAB_0021fde3;
    p_01 = (ushort *)((long)puStack_40 + 1);
    bVar1 = (byte)*puStack_40;
    uVar10 = (uint)bVar1;
    if (bVar1 == 0x1a) break;
    if (bVar1 == 0x10) goto LAB_0021fba2;
    if ((char)bVar1 < '\0') {
      uVar10 = ((uint)bVar1 + (uint)*(byte *)p_01 * 0x80) - 0x80;
      if ((char)*(byte *)p_01 < '\0') {
        puStack_40 = p_01;
        pVar12 = ReadTagFallback((char *)p_00,uVar10);
        uVar10 = pVar12.second;
        p_01 = (ushort *)pVar12.first;
      }
      else {
        p_01 = puStack_40 + 1;
      }
    }
    puStack_40 = p_01;
    if ((uVar10 == 0) || ((uVar10 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar10 - 1;
      goto LAB_0021fde3;
    }
    puStack_40 = (ushort *)ParseField(this,(ulong)uVar10,(char *)p_01,containing_type,metadata,ctx);
LAB_0021fb94:
    if (puStack_40 == (ushort *)0x0) goto LAB_0021fde0;
  }
  if ((int)ptr_local != 0) {
    puStack_40 = p_01;
    puStack_40 = (ushort *)
                 ParseField(this,((ulong)ptr_local & 0xffffffff) * 8 + 2,(char *)p_01,
                            containing_type,metadata,ctx);
LAB_0021fd17:
    ptr_local = (char *)0x0;
    goto LAB_0021fb94;
  }
  bVar1 = *(byte *)p_01;
  uVar10 = (uint)bVar1;
  if (-1 < (char)bVar1) {
    puStack_40 = puStack_40 + 1;
LAB_0021fd0b:
    puStack_40 = (ushort *)
                 EpsCopyInputStream::ReadString
                           (&ctx->super_EpsCopyInputStream,(char *)puStack_40,uVar10,
                            (string *)local_68);
    goto LAB_0021fd17;
  }
  puStack_40 = p_01;
  pVar13 = ReadSizeFallback((char *)p_01,(uint)bVar1);
  uVar10 = pVar13.second;
  puStack_40 = (ushort *)pVar13.first;
  if (puStack_40 != (ushort *)0x0) goto LAB_0021fd0b;
  goto LAB_0021fde0;
LAB_0021fba2:
  uVar7 = (uint)(char)*p_01;
  uVar10 = *p_01 + uVar7;
  uVar11 = uVar7 * 2 & uVar10;
  ptr_local = (char *)(ulong)(uVar11 >> 1);
  if ((short)uVar11 < 0) {
    p_01 = (ushort *)((long)puStack_40 + 3);
    lVar8 = 0xd;
    while( true ) {
      uVar7 = (uint)(char)*p_01;
      uVar10 = *p_01 + uVar7;
      uVar11 = uVar7 * 2 & uVar10;
      this_00 = (ExtensionSet *)(ulong)uVar11;
      ptr_local = (char *)((long)&((ExtensionSet *)ptr_local)->arena_ +
                          ((long)((long)&this_00[-1].map_ + 6) << ((byte)lVar8 & 0x3f)));
      if (-1 < (short)uVar11) break;
      lVar8 = lVar8 + 0xe;
      p_01 = p_01 + 1;
      if (lVar8 == 0x45) {
        puStack_40 = (ushort *)0x0;
        goto LAB_0021fde0;
      }
    }
    bVar4 = uVar10 < uVar7;
  }
  else {
    bVar4 = uVar10 < uVar7;
    this_00 = (ExtensionSet *)ptr_local;
  }
  puStack_40 = (ushort *)((long)p_01 + (ulong)bVar4 + 1);
  if (payload._M_dataplus._M_p == (pointer)0x0) goto LAB_0021faff;
  local_110 = (undefined1  [8])&PTR__ExtensionFinder_003b7b88;
  extension_00 = (string *)&tmp_ctx.data_.factory;
  tmp_ctx.super_EpsCopyInputStream.limit_end_ = (char *)containing_type;
  bVar4 = FindExtensionInfoFromFieldNumber
                    (this_00,2,(int)ptr_local,(ExtensionFinder *)local_110,
                     (ExtensionInfo *)extension_00,(bool *)(payload.field_2._M_local_buf + 0xf));
  _Var3 = payload._M_dataplus;
  auVar2 = local_68;
  if (bVar4) {
    if (tmp_ctx.data_.factory._1_1_ == '\x01') {
      pMVar6 = AddMessage(this,(int)ptr_local,'\v',(MessageLite *)extension._0_8_,
                          (FieldDescriptor *)extension.field_3.enum_validity_check.arg);
    }
    else {
      pMVar6 = MutableMessage(this,(int)ptr_local,'\v',(MessageLite *)extension._0_8_,
                              (FieldDescriptor *)extension.field_3.enum_validity_check.arg);
    }
    ParseContext::ParseContext<std::__cxx11::string&>
              ((ParseContext *)local_110,ctx->depth_,false,(char **)&extension.descriptor,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    tmp_ctx.depth_ = *(int *)&(ctx->data_).pool;
    tmp_ctx.group_depth_ = *(int *)((long)&(ctx->data_).pool + 4);
    tmp_ctx.data_.pool._0_4_ = *(undefined4 *)&(ctx->data_).factory;
    tmp_ctx.data_.pool._4_4_ = *(undefined4 *)((long)&(ctx->data_).factory + 4);
    iVar5 = (*pMVar6->_vptr_MessageLite[0xb])(pMVar6,extension.descriptor,local_110);
    if ((CONCAT44(extraout_var,iVar5) == 0) ||
       (ptr_local = (char *)0x0, (int)tmp_ctx.super_EpsCopyInputStream.aliasing_ != 0)) {
LAB_0021fde0:
      p_01 = (ushort *)0x0;
LAB_0021fde3:
      if (local_68 != (undefined1  [8])&payload._M_string_length) {
        operator_delete((void *)local_68);
      }
      return (char *)p_01;
    }
    goto LAB_0021faff;
  }
  if ((long)payload._M_dataplus._M_p < 0) {
    StringPiece::LogFatalSizeTooBig((size_t)payload._M_dataplus._M_p,"size_t to int conversion");
  }
  if (((ulong)metadata->ptr_ & 1) == 0) {
    pbVar9 = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>(metadata);
  }
  else {
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (((ulong)metadata->ptr_ & 0xfffffffffffffffe) + 8);
  }
  val.length_ = (stringpiece_ssize_type)pbVar9;
  val.ptr_ = _Var3._M_p;
  WriteLengthDelimited((internal *)ptr_local,auVar2._0_4_,val,extension_00);
  goto LAB_0021faf7;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(
    const char* ptr, const Msg* containing_type,
    internal::InternalMetadata* metadata, internal::ParseContext* ctx) {
  std::string payload;
  uint32 type_id = 0;
  while (!ctx->Done(&ptr)) {
    uint32 tag = static_cast<uint8>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64 tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (!payload.empty()) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, containing_type, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields<T>());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64>(type_id) * 8 + 2, ptr,
                                    containing_type, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32 size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, containing_type, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}